

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O3

Result __thiscall tonk::OutgoingQueue::PushAndGetFreshBuffer(OutgoingQueue *this)

{
  int iVar1;
  pthread_mutex_t *ppVar2;
  undefined8 uVar3;
  int iVar4;
  uint8_t *puVar5;
  OutgoingQueueCommon *pOVar6;
  undefined8 *puVar7;
  undefined8 *in_RSI;
  
  puVar5 = (uint8_t *)in_RSI[1];
  if (puVar5 == (uint8_t *)0x0) {
LAB_0014a92b:
    ppVar2 = (pthread_mutex_t *)*in_RSI;
    iVar1 = *(int *)((long)ppVar2 + 500);
    iVar4 = pthread_mutex_lock(ppVar2);
    if (iVar4 != 0) {
LAB_0014a9b7:
      std::__throw_system_error(iVar4);
    }
    puVar5 = pktalloc::Allocator::Allocate((Allocator *)&ppVar2[1].__data,iVar1 + 0x18);
    pthread_mutex_unlock(ppVar2);
    in_RSI[1] = puVar5;
    if (puVar5 == (uint8_t *)0x0) {
      pOVar6 = (OutgoingQueueCommon *)operator_new(0x38);
      (pOVar6->WriteAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex.__align =
           (long)"Out of memory";
      *(undefined1 **)
       ((long)&(pOVar6->WriteAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex + 8)
           = (undefined1 *)
             ((long)&(pOVar6->WriteAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex
             + 0x18);
      *(undefined8 *)
       ((long)&(pOVar6->WriteAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex +
       0x10) = 0;
      (pOVar6->WriteAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex.__size[0x18] =
           '\0';
      *(undefined4 *)&(pOVar6->WriteAllocator).Allocator.HugeChunkStart = 0;
      (pOVar6->WriteAllocator).Allocator.PreferredWindows.PreallocatedData[0] = (WindowHeader *)0x10
      ;
      goto LAB_0014a9a8;
    }
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    puVar5[8] = '\0';
    puVar5[9] = '\0';
    puVar5[10] = '\0';
    puVar5[0xb] = '\0';
    puVar5[0xc] = '\0';
    puVar5[0xd] = '\0';
    puVar5[0xe] = '\0';
    puVar5[0xf] = '\0';
  }
  else {
    iVar1 = *(int *)(puVar5 + 8);
    if (iVar1 != 0) {
      ppVar2 = (pthread_mutex_t *)*in_RSI;
      iVar4 = pthread_mutex_lock(ppVar2);
      if (iVar4 != 0) goto LAB_0014a9b7;
      pktalloc::Allocator::Shrink((Allocator *)&ppVar2[1].__data,puVar5,iVar1 + 0x3f);
      if (ppVar2 != (pthread_mutex_t *)0x0) {
        pthread_mutex_unlock(ppVar2);
      }
      uVar3 = in_RSI[1];
      puVar7 = in_RSI + 2;
      if ((undefined8 *)in_RSI[3] != (undefined8 *)0x0) {
        puVar7 = (undefined8 *)in_RSI[3];
      }
      *puVar7 = uVar3;
      in_RSI[3] = uVar3;
      goto LAB_0014a92b;
    }
  }
  pOVar6 = (OutgoingQueueCommon *)0x0;
LAB_0014a9a8:
  this->Common = pOVar6;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result OutgoingQueue::PushAndGetFreshBuffer()
{
    if (OutBuffer)
    {
        // If there was no data written yet:
        if (OutBuffer->NextWriteOffset <= 0) {
            return Result::Success();
        }

        const unsigned neededBytes = OutBuffer->NextWriteOffset + kAllocatedOverheadBytes;

        // Reduce memory usage
        Common->WriteAllocator.Shrink(OutBuffer,
            neededBytes);

        // Link at end of list (After NewestQueued)
        if (NewestQueued) {
            NewestQueued->Next = OutBuffer;
        }
        else {
            OldestQueued = OutBuffer;
        }
        NewestQueued = OutBuffer;
        TONK_DEBUG_ASSERT(OutBuffer->Next == nullptr);

        TONK_VERBOSE_OUTGOING_LOG("PushAndGetFreshBuffer : Flushed OutBuffer = ", OutBuffer);
    }

    OutBuffer = (OutgoingQueuedDatagram*)Common->WriteAllocator.Allocate(
        kQueueHeaderBytes + Common->UDPMaxDatagramBytes);

    if (!OutBuffer) {
        return Result::OutOfMemory();
    }

    OutBuffer->Initialize();

    TONK_VERBOSE_OUTGOING_LOG("PushAndGetFreshBuffer : Created new OutBuffer = ", OutBuffer);

    return Result::Success();
}